

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O2

int GetLengthMTMessage(uchar *buf)

{
  if (buf[3] != 0xff) {
    return buf[3] + 5;
  }
  return (ushort)(*(ushort *)(buf + 4) << 8 | *(ushort *)(buf + 4) >> 8) + 7;
}

Assistant:

inline int GetLengthMTMessage(unsigned char* buf)
{
	uShort_MT extlen;

	if (buf[3] == EXT_LEN_MT)
	{
		extlen.c[0] = buf[5];
		extlen.c[1] = buf[4];
		return extlen.v+MIN_EXTENDED_BUF_LEN_MT;
	}
	else
	{
		return buf[3]+MIN_STANDARD_BUF_LEN_MT;
	}
}